

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::JsonObjectVector<cfd::js::api::json::PsbtBip32Data,_cfd::js::api::PsbtBip32DataStruct>::
ConvertFromStruct(JsonObjectVector<cfd::js::api::json::PsbtBip32Data,_cfd::js::api::PsbtBip32DataStruct>
                  *this,vector<cfd::js::api::PsbtBip32DataStruct,_std::allocator<cfd::js::api::PsbtBip32DataStruct>_>
                        *list)

{
  bool bVar1;
  undefined1 local_f0 [8];
  PsbtBip32Data object;
  PsbtBip32DataStruct *element;
  const_iterator __end0;
  const_iterator __begin0;
  vector<cfd::js::api::PsbtBip32DataStruct,_std::allocator<cfd::js::api::PsbtBip32DataStruct>_>
  *__range3;
  vector<cfd::js::api::PsbtBip32DataStruct,_std::allocator<cfd::js::api::PsbtBip32DataStruct>_>
  *list_local;
  JsonObjectVector<cfd::js::api::json::PsbtBip32Data,_cfd::js::api::PsbtBip32DataStruct> *this_local
  ;
  
  __end0 = std::
           vector<cfd::js::api::PsbtBip32DataStruct,_std::allocator<cfd::js::api::PsbtBip32DataStruct>_>
           ::begin(list);
  element = (PsbtBip32DataStruct *)
            std::
            vector<cfd::js::api::PsbtBip32DataStruct,_std::allocator<cfd::js::api::PsbtBip32DataStruct>_>
            ::end(list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_cfd::js::api::PsbtBip32DataStruct_*,_std::vector<cfd::js::api::PsbtBip32DataStruct,_std::allocator<cfd::js::api::PsbtBip32DataStruct>_>_>
                                *)&element);
    if (!bVar1) break;
    object._176_8_ =
         __gnu_cxx::
         __normal_iterator<const_cfd::js::api::PsbtBip32DataStruct_*,_std::vector<cfd::js::api::PsbtBip32DataStruct,_std::allocator<cfd::js::api::PsbtBip32DataStruct>_>_>
         ::operator*(&__end0);
    js::api::json::PsbtBip32Data::PsbtBip32Data((PsbtBip32Data *)local_f0);
    js::api::json::PsbtBip32Data::ConvertFromStruct
              ((PsbtBip32Data *)local_f0,(PsbtBip32DataStruct *)object._176_8_);
    std::
    vector<cfd::js::api::json::PsbtBip32Data,_std::allocator<cfd::js::api::json::PsbtBip32Data>_>::
    push_back(&(this->super_JsonVector<cfd::js::api::json::PsbtBip32Data>).
               super_vector<cfd::js::api::json::PsbtBip32Data,_std::allocator<cfd::js::api::json::PsbtBip32Data>_>
              ,(value_type *)local_f0);
    js::api::json::PsbtBip32Data::~PsbtBip32Data((PsbtBip32Data *)local_f0);
    __gnu_cxx::
    __normal_iterator<const_cfd::js::api::PsbtBip32DataStruct_*,_std::vector<cfd::js::api::PsbtBip32DataStruct,_std::allocator<cfd::js::api::PsbtBip32DataStruct>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }